

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  undefined1 auVar4 [16];
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> this_00;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  cmValue cVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  char *pcVar10;
  Status SVar11;
  uint uVar12;
  ScopePushPop SVar13;
  string *psVar14;
  string_view separator;
  string_view algo;
  cmValue tempPackageFileName;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  pointer local_4d0;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  ScopePushPop pp;
  cmMakefile *local_4b8;
  pointer local_490;
  string hashFile;
  ostringstream cmCPackLog_msg_17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458 [22];
  string *local_2f0;
  ostringstream cmCPackLog_msg;
  uint auStack_2c8 [120];
  string filename;
  string local_c8;
  string findExpr;
  Glob gl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package using ");
  poVar7 = std::operator<<(poVar7,(string *)&this->Name);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x40e,_cmCPackLog_msg_17);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar6 = PrepareNames(this);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = (*this->_vptr_cmCPackGenerator[6])(this);
  if (iVar6 == 0) {
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
             (allocator<char> *)&cmCPackLog_msg_17);
  GetOption(this,(string *)&cmCPackLog_msg);
  bVar5 = cmIsOn((cmValue)0x159ba5);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&cmCPackLog_msg_17);
    cVar8 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    psVar14 = cVar8.Value;
    if (cVar8.Value == (string *)0x0) {
      psVar14 = &cmValue::Empty_abi_cxx11_;
    }
    bVar5 = cmsys::SystemTools::FileExists(psVar14);
    if (bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove toplevel directory: ");
      poVar7 = operator<<(poVar7,cVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x420,_cmCPackLog_msg_17);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      bVar5 = cmSystemTools::RepeatedRemoveDirectory(psVar14);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem removing toplevel directory: ")
        ;
        poVar7 = operator<<(poVar7,cVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x424,_cmCPackLog_msg_17);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"About to install project ");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42a,_cmCPackLog_msg_17);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar6 = InstallProject(this);
  if (iVar6 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Done install project ");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42f,_cmCPackLog_msg_17);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)&cmCPackLog_msg_17);
  tempPackageFileName = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",
             (allocator<char> *)&cmCPackLog_msg_17);
  psVar14 = (string *)GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Find files");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x435,_cmCPackLog_msg_17);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  cmsys::Glob::Glob(&gl);
  if (psVar14 == (string *)0x0) {
    psVar14 = &cmValue::Empty_abi_cxx11_;
  }
  _cmCPackLog_msg = (pointer)psVar14->_M_string_length;
  _cmCPackLog_msg_17 = (pointer)0x2;
  cmStrCat<>(&findExpr,(cmAlphaNum *)&cmCPackLog_msg,(cmAlphaNum *)&cmCPackLog_msg_17);
  gl.Recurse = true;
  gl.RecurseListDirs = true;
  gl.RecurseThroughSymlinks = false;
  bVar5 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x441,_cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Package files to: ");
    if (tempPackageFileName.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg_17,"(NULL)",&local_4d1);
    }
    else {
      std::__cxx11::string::string((string *)&cmCPackLog_msg_17,(string *)tempPackageFileName.Value)
      ;
    }
    poVar7 = std::operator<<(poVar7,(string *)&cmCPackLog_msg_17);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x445,_cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cVar8 = tempPackageFileName;
    if (tempPackageFileName.Value == (string *)0x0) {
      cVar8.Value = &cmValue::Empty_abi_cxx11_;
    }
    bVar5 = cmsys::SystemTools::FileExists(cVar8.Value);
    if (bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove old package file");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x448,_cmCPackLog_msg_17);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      cVar8 = tempPackageFileName;
      if (tempPackageFileName.Value == (string *)0x0) {
        cVar8.Value = &cmValue::Empty_abi_cxx11_;
      }
      cmsys::SystemTools::RemoveFile(cVar8.Value);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&cmCPackLog_msg_17);
    GetOption(this,(string *)&cmCPackLog_msg);
    bVar5 = cmIsOn((cmValue)0x15a2ab);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
                 (allocator<char> *)&cmCPackLog_msg_17);
      GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,pvVar9);
    pvVar9 = &this->packageFileNames;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(pvVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<cmValue&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar9,
               &tempPackageFileName);
    std::__cxx11::string::_M_assign((string *)&this->toplevel);
    pp.Makefile = this->MakefileMap;
    cmMakefile::PushScope(pp.Makefile);
    pcVar2 = this->MakefileMap;
    pcVar10 = cmVersion::GetCMakeVersion();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar10,(allocator<char> *)&filename);
    _cmCPackLog_msg_17 = (pointer)local_458;
    local_458[0]._M_local_buf[0] = '\0';
    cmMakefile::SetPolicyVersion(pcVar2,(string *)&cmCPackLog_msg,(string *)&cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    iVar6 = (*this->_vptr_cmCPackGenerator[9])();
    if ((iVar6 != 0) && (bVar5 = cmSystemTools::GetErrorOccurredFlag(), !bVar5)) {
      cmMakefile::ScopePushPop::~ScopePushPop(&pp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_POST_BUILD_SCRIPTS",
                 (allocator<char> *)&cmCPackLog_msg_17);
      cVar8 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar8.Value != (string *)0x0) {
        pcVar2 = this->MakefileMap;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_FILES",(allocator<char> *)&pp);
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin((string *)&cmCPackLog_msg_17,pvVar9,separator,(string_view)ZEXT816(0));
        auVar4._8_8_ = 0;
        auVar4._0_8_ = _cmCPackLog_msg_17;
        cmMakefile::AddDefinition(pcVar2,(string *)&cmCPackLog_msg,(string_view)(auVar4 << 0x40));
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&pp,cVar8,false);
        for (SVar13 = pp; SVar13.Makefile != local_4b8;
            SVar13.Makefile =
                 (cmMakefile *)
                 &((SVar13.Makefile)->FindPackageRootPathStack).
                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Executing post-build script: ");
          poVar7 = std::operator<<(poVar7,(string *)SVar13.Makefile);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x46f,_cmCPackLog_msg_17);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          bVar5 = cmMakefile::ReadListFile(this->MakefileMap,(string *)SVar13.Makefile);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"The post-build script not found: ")
            ;
            poVar7 = std::operator<<(poVar7,(string *)SVar13.Makefile);
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x474,_cmCPackLog_msg_17);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pp);
            goto LAB_0015a47b;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pp);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_CHECKSUM",
                 (allocator<char> *)&cmCPackLog_msg_17);
      psVar14 = (string *)GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (psVar14 == (string *)0x0) {
        psVar14 = &cmValue::Empty_abi_cxx11_;
      }
      algo._M_str = (char *)psVar14->_M_string_length;
      algo._M_len = (size_t)&crypto;
      cmCryptoHash::New(algo);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Copying final package(s) [");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,"]:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      local_2f0 = psVar14;
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x486,_cmCPackLog_msg_17);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      pbVar3 = (this->packageFileNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_4d0 = (this->packageFileNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_490 = local_4d0;
      for (; local_4d0 != pbVar3; local_4d0 = local_4d0 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",
                   (allocator<char> *)&cmCPackLog_msg_17);
        psVar14 = (string *)
                  GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&cmCPackLog_msg);
        if (psVar14 == (string *)0x0) {
          psVar14 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&pp,(string *)psVar14);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        cmsys::SystemTools::GetFilenameName(&filename,local_4d0);
        tempPackageFileName.Value = local_490;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,"/",&filename);
        std::__cxx11::string::append((string *)&pp);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        SVar13 = pp;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Copy final package(s): ");
        if (tempPackageFileName.Value == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg_17,"(NULL)",&local_4d2);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&cmCPackLog_msg_17,(string *)tempPackageFileName.Value);
        }
        poVar7 = std::operator<<(poVar7,(string *)&cmCPackLog_msg_17);
        poVar7 = std::operator<<(poVar7," to ");
        pcVar10 = (char *)SVar13;
        if (SVar13.Makefile == (cmMakefile *)0x0) {
          pcVar10 = "(NULL)";
        }
        poVar7 = std::operator<<(poVar7,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x492,_cmCPackLog_msg_17);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        SVar11 = cmsys::SystemTools::CopyFileIfDifferent(local_4d0,(string *)&pp);
        if (SVar11.Kind_ != Success) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem copying the package: ");
          if (tempPackageFileName.Value == (string *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cmCPackLog_msg_17,"(NULL)",(allocator<char> *)&hashFile);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&cmCPackLog_msg_17,(string *)tempPackageFileName.Value);
          }
          poVar7 = std::operator<<(poVar7,(string *)&cmCPackLog_msg_17);
          poVar7 = std::operator<<(poVar7," to ");
          poVar7 = std::operator<<(poVar7,pcVar10);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x498,_cmCPackLog_msg_17);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_0015add0:
          std::__cxx11::string::~string((string *)&filename);
          std::__cxx11::string::~string((string *)&pp);
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"- package: ");
        poVar7 = std::operator<<(poVar7,(char *)SVar13.Makefile);
        poVar7 = std::operator<<(poVar7," generated.");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x49d,_cmCPackLog_msg_17);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        if ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
            crypto._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t
            .super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
            super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",
                     (allocator<char> *)&cmCPackLog_msg_17);
          psVar14 = (string *)
                    GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&cmCPackLog_msg);
          if (psVar14 == (string *)0x0) {
            psVar14 = &cmValue::Empty_abi_cxx11_;
          }
          std::__cxx11::string::string((string *)&hashFile,(string *)psVar14);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,"/",&filename);
          std::__cxx11::string::append((string *)&hashFile);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          cmsys::SystemTools::LowerCase((string *)&cmCPackLog_msg_17,local_2f0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,".",(string *)&cmCPackLog_msg_17);
          std::__cxx11::string::append((string *)&hashFile);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
          std::ofstream::ofstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,hashFile._M_dataplus._M_p,_S_out);
          this_00 = crypto;
          uVar12 = *(uint *)((long)auStack_2c8 + *(long *)(_cmCPackLog_msg + -0x18));
          if ((uVar12 & 5) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c8,(char *)SVar13.Makefile,&local_4d3);
            cmCryptoHash::HashFile
                      ((string *)&cmCPackLog_msg_17,
                       (cmCryptoHash *)
                       this_00._M_t.
                       super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                       super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,&local_c8);
            poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,(string *)&cmCPackLog_msg_17);
            poVar7 = std::operator<<(poVar7,"  ");
            poVar7 = std::operator<<(poVar7,(string *)&filename);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_17);
            poVar7 = std::operator<<((ostream *)&cmCPackLog_msg_17,"- checksum file: ");
            poVar7 = std::operator<<(poVar7,(string *)&hashFile);
            poVar7 = std::operator<<(poVar7," generated.");
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x4ae,local_c8._M_dataplus._M_p);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_17);
            poVar7 = std::operator<<((ostream *)&cmCPackLog_msg_17,"Cannot create checksum file: ");
            poVar7 = std::operator<<(poVar7,(string *)&hashFile);
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x4a8,local_c8._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_17);
          std::ofstream::~ofstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&hashFile);
          if ((uVar12 & 5) != 0) goto LAB_0015add0;
        }
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&pp);
        local_490 = local_490 + 1;
      }
      uVar12 = (uint)(local_4d0 == pbVar3);
      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&crypto);
      goto LAB_0015a47d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem compressing the directory");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x462,_cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmMakefile::ScopePushPop::~ScopePushPop(&pp);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find any files in the packaging tree");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x43d,_cmCPackLog_msg_17);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_17);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
LAB_0015a47b:
  uVar12 = 0;
LAB_0015a47d:
  std::__cxx11::string::~string((string *)&findExpr);
  cmsys::Glob::~Glob(&gl);
  return uVar12;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmIsOn(this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    cmValue toplevelDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  cmValue tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  cmValue tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = cmStrCat(tempDirectory, "/*");
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmIsOn(this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  this->files = gl.GetFiles();

  this->packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  this->packageFileNames.emplace_back(tempPackageFileName);
  this->toplevel = *tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccurredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }
  // Run post-build actions
  cmValue postBuildScripts = this->GetOption("CPACK_POST_BUILD_SCRIPTS");
  if (postBuildScripts) {
    this->MakefileMap->AddDefinition("CPACK_PACKAGE_FILES",
                                     cmJoin(this->packageFileNames, ";"));

    const auto scripts = cmExpandedList(postBuildScripts, false);
    for (const auto& script : scripts) {
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "Executing post-build script: " << script << std::endl);

      if (!this->MakefileMap->ReadListFile(script)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "The post-build script not found: " << script
                                                          << std::endl);
        return 0;
      }
    }
  }

  /* Prepare checksum algorithm*/
  cmValue algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(*algo);

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << this->packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : this->packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = cmValue(pkgFileName);
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? *tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}